

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Convert_U8_To_F32_SSE2(uint8_t *src,float *dst,uint32_t len)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  float *pfVar13;
  uint32_t uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint8_t *puVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  long lVar21;
  ushort uVar22;
  ushort uVar23;
  undefined1 auVar24 [16];
  
  uVar15 = (ulong)(len - 1);
  puVar18 = src + uVar15;
  pfVar13 = dst + (uVar15 - 0xf);
  if ((len != 0) && (((ulong)pfVar13 & 0xf) != 0)) {
    pfVar13 = dst + (uVar15 - 0x10);
    iVar20 = 1 - len;
    lVar17 = 0x3c;
    lVar16 = 0;
    do {
      dst[uVar15 + lVar16] = (float)puVar18[lVar16] * 0.0078125 + -1.0;
      len = len - 1;
      lVar21 = lVar16 + -1;
      lVar17 = lVar17 + 4;
      if (iVar20 == (int)lVar16) break;
      uVar3 = (ulong)pfVar13 & 0xf;
      pfVar13 = pfVar13 + -1;
      lVar16 = lVar21;
    } while (uVar3 != 0);
    puVar18 = puVar18 + lVar21;
    pfVar13 = (float *)((long)dst + (uVar15 * 4 - lVar17));
  }
  auVar12 = _DAT_0012aac0;
  pauVar19 = (undefined1 (*) [16])(puVar18 + -0xf);
  uVar14 = len;
  if (0xf < (int)len && ((ulong)pauVar19 & 0xf) == 0) {
    do {
      auVar1 = *pauVar19;
      auVar24 = auVar1 & auVar12;
      uVar22 = auVar1._6_2_ >> 8;
      uVar23 = auVar1._8_2_ >> 8;
      auVar10._2_2_ = uVar23;
      auVar10._0_2_ = uVar22;
      auVar4._10_2_ = 0;
      auVar4._0_10_ = auVar24._0_10_;
      auVar4._12_2_ = auVar24._6_2_;
      auVar6._8_2_ = auVar24._4_2_;
      auVar6._0_8_ = auVar24._0_8_;
      auVar6._10_4_ = auVar4._10_4_;
      auVar8._6_8_ = 0;
      auVar8._0_6_ = auVar6._8_6_;
      auVar7._4_2_ = auVar24._2_2_;
      auVar7._0_4_ = auVar24._0_4_;
      auVar7._6_8_ = SUB148(auVar8 << 0x40,6);
      auVar10._4_8_ = 0;
      auVar5._12_2_ = uVar22;
      auVar5._0_12_ = auVar10 << 0x30;
      uVar11 = CONCAT44(auVar5._10_4_,CONCAT22(auVar1._4_2_ >> 8,uVar22));
      auVar9._6_8_ = 0;
      auVar9._0_6_ = (uint6)((ulong)uVar11 >> 0x10);
      *pfVar13 = (float)(auVar24._0_4_ & 0xffff) * 0.0078125 + -1.0;
      pfVar13[1] = (float)(ushort)(auVar1._0_2_ >> 8) * 0.0078125 + -1.0;
      pfVar13[2] = (float)auVar7._4_4_ * 0.0078125 + -1.0;
      pfVar13[3] = (float)(int)CONCAT82(SUB148(auVar9 << 0x40,6),auVar1._2_2_ >> 8) * 0.0078125 +
                   -1.0;
      pfVar13[4] = (float)auVar6._8_4_ * 0.0078125 + -1.0;
      pfVar13[5] = (float)(int)((ulong)uVar11 >> 0x10) * 0.0078125 + -1.0;
      pfVar13[6] = (float)(auVar4._10_4_ >> 0x10) * 0.0078125 + -1.0;
      pfVar13[7] = (float)(auVar5._10_4_ >> 0x10) * 0.0078125 + -1.0;
      *(ulong *)(pfVar13 + 8) =
           CONCAT44((float)uVar23 * 0.0078125 + -1.0,(float)auVar24._8_2_ * 0.0078125 + -1.0);
      pfVar13[0xc] = (float)auVar24._10_2_ * 0.0078125 + -1.0;
      pfVar13[0xd] = (float)(ushort)(auVar1._10_2_ >> 8) * 0.0078125 + -1.0;
      pfVar13[0xc] = (float)auVar24._12_2_ * 0.0078125 + -1.0;
      pfVar13[0xd] = (float)(ushort)(auVar1._12_2_ >> 8) * 0.0078125 + -1.0;
      pfVar13[0xe] = (float)auVar24._14_2_ * 0.0078125 + -1.0;
      pfVar13[0xf] = (float)(ushort)(auVar1._14_2_ >> 8) * 0.0078125 + -1.0;
      uVar14 = len - 0x10;
      pauVar19 = pauVar19 + -1;
      pfVar13 = pfVar13 + -0x10;
      bVar2 = 0x1f < (int)len;
      len = uVar14;
    } while (bVar2);
  }
  if (uVar14 != 0) {
    lVar16 = 0xf;
    do {
      pfVar13[lVar16] = (float)(byte)(*pauVar19)[lVar16] * 0.0078125 + -1.0;
      lVar16 = lVar16 + -1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_U8_To_F32_SSE2(
	const uint8_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;
    src += len - 1;
    dst += len - 1;

    /* Get dst aligned to 16 bytes (since buffer is growing, we don't have to worry about overreading from src) */
    for (i = len; i && (((size_t) (dst-15)) & 15); --i, --src, --dst) {
        *dst = (((float) *src) * DIVBY128) - 1.0f;
    }

    src -= 15; dst -= 15;  /* adjust to read SSE blocks from the start. */
    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128i *mmsrc = (const __m128i *) src;
        const __m128i zero = _mm_setzero_si128();
        const __m128 divby128 = _mm_set1_ps(DIVBY128);
        const __m128 minus1 = _mm_set1_ps(-1.0f);
        while (i >= 16) {   /* 16 * 8-bit */
            const __m128i bytes = _mm_load_si128(mmsrc);  /* get 16 uint8 into an XMM register. */
            /* treat as int16, shift left to clear every other sint16, then back right with zero-extend. Now uint16. */
            const __m128i shorts1 = _mm_srli_epi16(_mm_slli_epi16(bytes, 8), 8);
            /* right-shift-zero-extend gets us uint16 with the other set of values. */
            const __m128i shorts2 = _mm_srli_epi16(bytes, 8);
            /* unpack against zero to make these int32, convert to float, multiply, add. Whew! */
            /* Note that AVX2 can do floating point multiply+add in one instruction, fwiw. SSE2 cannot. */
            const __m128 floats1 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi16(shorts1, zero)), divby128), minus1);
            const __m128 floats2 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi16(shorts2, zero)), divby128), minus1);
            const __m128 floats3 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi16(shorts1, zero)), divby128), minus1);
            const __m128 floats4 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi16(shorts2, zero)), divby128), minus1);
            /* Interleave back into correct order, store. */
            _mm_store_ps(dst, _mm_unpacklo_ps(floats1, floats2));
            _mm_store_ps(dst+4, _mm_unpackhi_ps(floats1, floats2));
            _mm_store_ps(dst+8, _mm_unpacklo_ps(floats3, floats4));
            _mm_store_ps(dst+12, _mm_unpackhi_ps(floats3, floats4));
            i -= 16; mmsrc--; dst -= 16;
        }

        src = (const uint8_t *) mmsrc;
    }

    src += 15; dst += 15;  /* adjust for any scalar finishing. */

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = (((float) *src) * DIVBY128) - 1.0f;
        i--; src--; dst--;
    }
}